

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O3

NativePath * __thiscall
QTemporaryFileName::generateNext(NativePath *__return_storage_ptr__,QTemporaryFileName *this)

{
  Data *pDVar1;
  long lVar2;
  QRandomGenerator *this_00;
  quint64 qVar3;
  char cVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  
  pDVar1 = (this->path).d.d;
  if ((pDVar1 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
    QByteArray::reallocData(&this->path,(this->path).d.size,KeepSize);
  }
  pcVar7 = (this->path).d.ptr;
  lVar6 = this->length;
  if (lVar6 != 0) {
    lVar2 = this->pos;
    this_00 = &QRandomGenerator64::global()->super_QRandomGenerator;
    do {
      qVar3 = QRandomGenerator::_fillRange(this_00,(void *)0x0,1);
      uVar5 = (uint)qVar3 & 0x3ff;
      cVar4 = 'G';
      if (uVar5 < 0x200) {
        cVar4 = 'A';
      }
      pcVar7[lVar6 + lVar2 + -1] = cVar4 + (char)(uVar5 * 0x34 >> 10);
      if (lVar6 == 1) break;
      uVar5 = (uint)(qVar3 >> 10) & 0x3ff;
      cVar4 = 'G';
      if (uVar5 < 0x200) {
        cVar4 = 'A';
      }
      pcVar7[lVar6 + lVar2 + -2] = cVar4 + (char)(uVar5 * 0x34 >> 10);
      if (lVar6 == 2) break;
      uVar5 = (uint)qVar3 >> 0x14 & 0x3ff;
      cVar4 = 'G';
      if (uVar5 < 0x200) {
        cVar4 = 'A';
      }
      pcVar7[lVar6 + lVar2 + -3] = cVar4 + (char)(uVar5 * 0x34 >> 10);
      lVar6 = lVar6 + -3;
    } while (lVar6 != 0);
    pcVar7 = (this->path).d.ptr;
  }
  pDVar1 = (this->path).d.d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = pcVar7;
  (__return_storage_ptr__->d).size = (this->path).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

QFileSystemEntry::NativePath QTemporaryFileName::generateNext()
{
    Q_ASSERT(length != 0);
    Q_ASSERT(pos < path.size());
    Q_ASSERT(length <= path.size() - pos);

    Char *const placeholderStart = (Char *)path.data() + pos;
    Char *const placeholderEnd = placeholderStart + length;

    // Replace placeholder with random chars.
    {
        // Since our dictionary is 26+26 characters, it would seem we only need
        // a random number from 0 to 63 to select a character. However, due to
        // the limited range, that would mean 12 (64-52) characters have double
        // the probability of the others: 1 in 32 instead of 1 in 64.
        //
        // To overcome this limitation, we use more bits per character. With 10
        // bits, there are 16 characters with probability 19/1024 and the rest
        // at 20/1024 (i.e, less than .1% difference). This allows us to do 3
        // characters per 32-bit random number, which is also half the typical
        // placeholder length.
        enum { BitsPerCharacter = 10 };

        Char *rIter = placeholderEnd;
        while (rIter != placeholderStart) {
            quint32 rnd = QRandomGenerator::global()->generate();
            auto applyOne = [&]() {
                quint32 v = rnd & ((1 << BitsPerCharacter) - 1);
                rnd >>= BitsPerCharacter;
                char ch = char((26 + 26) * v / (1 << BitsPerCharacter));
                if (ch < 26)
                    *--rIter = Latin1Char(ch + 'A');
                else
                    *--rIter = Latin1Char(ch - 26 + 'a');
            };

            applyOne();
            if (rIter == placeholderStart)
                break;

            applyOne();
            if (rIter == placeholderStart)
                break;

            applyOne();
        }
    }

    return path;
}